

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HSimplexNlaFreeze.cpp
# Opt level: O0

void __thiscall SimplexIterate::clear(SimplexIterate *this)

{
  InvertibleRepresentation *in_RDI;
  
  *(undefined1 *)
   &(in_RDI->l_pivot_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_start = 0;
  SimplexBasis::clear((SimplexBasis *)in_RDI);
  InvertibleRepresentation::clear(in_RDI);
  std::vector<double,_std::allocator<double>_>::clear
            ((vector<double,_std::allocator<double>_> *)0x7c15a1);
  return;
}

Assistant:

void SimplexIterate::clear() {
  this->valid_ = false;
  this->basis_.clear();
  this->invert_.clear();
  this->dual_edge_weight_.clear();
}